

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O1

void google::RemoveLogSink(LogSink *destination)

{
  LogSink **__src;
  undefined8 *puVar1;
  int iVar2;
  __normal_iterator<google::LogSink_**,_std::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>_>
  __dest;
  long lVar3;
  LogSink *local_20;
  
  local_20 = destination;
  iVar2 = pthread_rwlock_wrlock((pthread_rwlock_t *)LogDestination::sink_mutex_);
  puVar1 = LogDestination::sinks_;
  if (iVar2 != 0x23) {
    if (LogDestination::sinks_ != (undefined8 *)0x0) {
      __dest = std::
               __remove_if<__gnu_cxx::__normal_iterator<google::LogSink**,std::vector<google::LogSink*,std::allocator<google::LogSink*>>>,__gnu_cxx::__ops::_Iter_equals_val<google::LogSink*const>>
                         ((LogSink **)*LogDestination::sinks_,(LogSink **)LogDestination::sinks_[1],
                          &local_20);
      __src = (LogSink **)LogDestination::sinks_[1];
      if (__dest._M_current != __src) {
        if (puVar1[1] - (long)__src != 0) {
          memmove(__dest._M_current,__src,puVar1[1] - (long)__src);
        }
        lVar3 = (long)__dest._M_current + (puVar1[1] - (long)__src);
        if (puVar1[1] != lVar3) {
          puVar1[1] = lVar3;
        }
      }
    }
    pthread_rwlock_unlock((pthread_rwlock_t *)LogDestination::sink_mutex_);
    return;
  }
  std::__throw_system_error(0x23);
}

Assistant:

void RemoveLogSink(LogSink* destination) {
  LogDestination::RemoveLogSink(destination);
}